

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfFunctionBlocker::Replay
          (cmIfFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  string *psVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  cmake *pcVar5;
  pointer lff;
  int iVar6;
  MessageType messType;
  cmIfFunctionBlocker *local_340;
  cmExecutionStatus *local_338;
  cmListFileBacktrace elseifBT;
  cmExecutionStatus status;
  string errorString;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string local_280;
  cmListFileBacktrace elseBT;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_230;
  string local_220;
  string err;
  string local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  cmAlphaNum local_1a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  string local_150;
  string local_130;
  cmListFileContext local_110;
  cmListFileContext local_a0;
  
  this_00 = inStatus->Makefile;
  lff = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  psVar1 = &(this->super_cmFunctionBlocker).StartingContext.FilePath;
  iVar6 = 0;
  local_340 = this;
  local_338 = inStatus;
  do {
    if (lff == pcVar2) {
      return true;
    }
    bVar3 = std::operator==(&((lff->Impl).
                              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->LowerCaseName,"if");
    bVar4 = std::operator==(&((lff->Impl).
                              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->LowerCaseName,"endif");
    iVar6 = (iVar6 + (uint)bVar3) - (uint)bVar4;
    if (iVar6 == 0) {
      bVar3 = std::operator==(&((lff->Impl).
                                super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->LowerCaseName,"else");
      if (bVar3) {
        cmMakefile::GetBacktrace((cmMakefile *)&status);
        std::__cxx11::string::string
                  ((string *)&local_1e0,
                   (string *)
                   (lff->Impl).
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::__cxx11::string::string((string *)&local_130,(string *)psVar1);
        cmListFileContext::cmListFileContext
                  (&local_a0,&local_1e0,&local_130,
                   ((lff->Impl).
                    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->Line);
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                  (&elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>,
                   (cmListFileContext *)&status);
        cmListFileContext::~cmListFileContext(&local_a0);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&status.Error);
        bVar3 = local_340->ElseSeen;
        if (bVar3 == true) {
          pcVar5 = cmMakefile::GetCMakeInstance(this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&status,"A duplicate ELSE command was found inside an IF block.",
                     (allocator<char> *)&local_1a8);
          cmake::IssueMessage(pcVar5,FATAL_ERROR,(string *)&status,&elseBT);
          std::__cxx11::string::~string((string *)&status);
          cmSystemTools::s_FatalErrorOccurred = true;
        }
        else {
          bVar4 = local_340->HasRun;
          local_340->IsBlocking = bVar4;
          local_340->HasRun = true;
          local_340->ElseSeen = true;
          if ((bVar4 == false) &&
             (pcVar5 = cmMakefile::GetCMakeInstance(this_00), pcVar5->Trace == true)) {
            cmMakefile::PrintCommandTrace(this_00,lff,&elseBT,Yes);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        if (bVar3 != false) {
          return true;
        }
      }
      else {
        bVar3 = std::operator==(&((lff->Impl).
                                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->LowerCaseName,"elseif");
        if (!bVar3) goto LAB_0023769f;
        cmMakefile::GetBacktrace((cmMakefile *)&status);
        std::__cxx11::string::string
                  ((string *)&local_280,
                   (string *)
                   (lff->Impl).
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        std::__cxx11::string::string((string *)&local_150,(string *)psVar1);
        cmListFileContext::cmListFileContext
                  (&local_110,&local_280,&local_150,
                   ((lff->Impl).
                    super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->Line);
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                  (&elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>,
                   (cmListFileContext *)&status);
        cmListFileContext::~cmListFileContext(&local_110);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_280);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&status.Error);
        if (local_340->ElseSeen == true) {
          pcVar5 = cmMakefile::GetCMakeInstance(this_00);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&status,"An ELSEIF command was found after an ELSE command.",
                     (allocator<char> *)&elseBT);
          cmake::IssueMessage(pcVar5,FATAL_ERROR,(string *)&status,&elseifBT);
          std::__cxx11::string::~string((string *)&status);
          cmSystemTools::s_FatalErrorOccurred = true;
LAB_00237c5f:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          return true;
        }
        if (local_340->HasRun == true) {
          local_340->IsBlocking = true;
        }
        else {
          pcVar5 = cmMakefile::GetCMakeInstance(this_00);
          if (pcVar5->Trace == true) {
            cmMakefile::PrintCommandTrace(this_00,lff,&elseifBT,Yes);
          }
          errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
          errorString._M_string_length = 0;
          expandedArguments.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          errorString.field_2._M_local_buf[0] = '\0';
          expandedArguments.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expandedArguments.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cmMakefile::ExpandArguments
                    (this_00,&((lff->Impl).
                               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->Arguments,&expandedArguments);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_230,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&elseifBT);
          cmConditionEvaluator::cmConditionEvaluator
                    ((cmConditionEvaluator *)&status,this_00,(cmListFileBacktrace *)&local_230);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230._M_refcount);
          bVar3 = cmConditionEvaluator::IsTrue
                            ((cmConditionEvaluator *)&status,&expandedArguments,&errorString,
                             &messType);
          if (errorString._M_string_length != 0) {
            cmIfCommandError_abi_cxx11_(&local_220,&expandedArguments);
            elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_220._M_string_length;
            elseBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._M_dataplus._M_p;
            local_1a8.View_._M_len = errorString._M_string_length;
            local_1a8.View_._M_str = errorString._M_dataplus._M_p;
            cmStrCat<>(&err,(cmAlphaNum *)&elseBT,&local_1a8);
            std::__cxx11::string::~string((string *)&local_220);
            pcVar5 = cmMakefile::GetCMakeInstance(this_00);
            cmake::IssueMessage(pcVar5,messType,&err,&elseifBT);
            if (messType == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccurred = true;
              std::__cxx11::string::~string((string *)&err);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &status.Error._M_string_length);
              std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
              ~vector(&expandedArguments);
              std::__cxx11::string::~string((string *)&errorString);
              goto LAB_00237c5f;
            }
            std::__cxx11::string::~string((string *)&err);
          }
          if (bVar3) {
            local_340->IsBlocking = false;
            local_340->HasRun = true;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&status.Error._M_string_length);
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector(&expandedArguments);
          std::__cxx11::string::~string((string *)&errorString);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&elseifBT.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
    else {
LAB_0023769f:
      if (local_340->IsBlocking == false) {
        cmExecutionStatus::cmExecutionStatus(&status,this_00);
        local_178._M_engaged = false;
        cmMakefile::ExecuteCommand
                  (this_00,lff,&status,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_178);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_178);
        if (status.ReturnInvoked == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_1c0,&status.Variables);
          cmExecutionStatus::SetReturnInvoked(local_338,&local_1c0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1c0);
LAB_00237bb5:
          cmExecutionStatus::~cmExecutionStatus(&status);
          return true;
        }
        if (status.BreakInvoked == true) {
          local_338->BreakInvoked = true;
          goto LAB_00237bb5;
        }
        if (status.ContinueInvoked == true) {
          local_338->ContinueInvoked = true;
          goto LAB_00237bb5;
        }
        cmExecutionStatus::~cmExecutionStatus(&status);
      }
    }
    lff = lff + 1;
  } while( true );
}

Assistant:

bool cmIfFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                 cmExecutionStatus& inStatus)
{
  cmMakefile& mf = inStatus.GetMakefile();
  // execute the functions for the true parts of the if statement
  int scopeDepth = 0;
  for (cmListFileFunction const& func : functions) {
    // keep track of scope depth
    if (func.LowerCaseName() == "if") {
      scopeDepth++;
    }
    if (func.LowerCaseName() == "endif") {
      scopeDepth--;
    }
    // watch for our state change
    if (scopeDepth == 0 && func.LowerCaseName() == "else") {
      cmListFileBacktrace elseBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });

      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "A duplicate ELSE command was found inside an IF block.", elseBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      this->IsBlocking = this->HasRun;
      this->HasRun = true;
      this->ElseSeen = true;

      // if trace is enabled, print a (trivially) evaluated "else"
      // statement
      if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
        mf.PrintCommandTrace(func, elseBT,
                             cmMakefile::CommandMissingFromStack::Yes);
      }
    } else if (scopeDepth == 0 && func.LowerCaseName() == "elseif") {
      cmListFileBacktrace elseifBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });
      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "An ELSEIF command was found after an ELSE command.", elseifBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      if (this->HasRun) {
        this->IsBlocking = true;
      } else {
        // if trace is enabled, print the evaluated "elseif" statement
        if (mf.GetCMakeInstance()->GetTrace()) {
          mf.PrintCommandTrace(func, elseifBT,
                               cmMakefile::CommandMissingFromStack::Yes);
        }

        std::string errorString;

        std::vector<cmExpandedCommandArgument> expandedArguments;
        mf.ExpandArguments(func.Arguments(), expandedArguments);

        MessageType messType;

        cmConditionEvaluator conditionEvaluator(mf, elseifBT);

        bool isTrue =
          conditionEvaluator.IsTrue(expandedArguments, errorString, messType);

        if (!errorString.empty()) {
          std::string err =
            cmStrCat(cmIfCommandError(expandedArguments), errorString);
          mf.GetCMakeInstance()->IssueMessage(messType, err, elseifBT);
          if (messType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccurred();
            return true;
          }
        }

        if (isTrue) {
          this->IsBlocking = false;
          this->HasRun = true;
        }
      }
    }

    // should we execute?
    else if (!this->IsBlocking) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(func, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        inStatus.SetBreakInvoked();
        return true;
      }
      if (status.GetContinueInvoked()) {
        inStatus.SetContinueInvoked();
        return true;
      }
    }
  }
  return true;
}